

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int IFN_Next_Character(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  field = form->current;
  iVar2 = form->curcol + 1;
  form->curcol = iVar2;
  if (iVar2 == field->dcols) {
    iVar2 = form->currow;
    form->currow = iVar2 + 1;
    iVar4 = 0;
    if (iVar2 + 1 == field->drows) {
      iVar3 = (int)field->rows;
      iVar4 = field->nrow;
      if (iVar4 + iVar3 != 1) {
        _Var1 = Field_Grown(field,1);
        iVar2 = 0;
        iVar4 = 0;
        if (_Var1) goto LAB_0037e7c4;
        iVar3 = (int)field->rows;
        iVar4 = field->nrow;
        iVar2 = form->currow + -1;
      }
      form->currow = iVar2;
      if (iVar3 + iVar4 == 1) {
        _Var1 = Field_Grown(field,1);
        if (_Var1) goto LAB_0037e7b2;
      }
      iVar4 = form->curcol + -1;
      iVar2 = -0xc;
    }
    else {
      iVar2 = 0;
    }
LAB_0037e7c4:
    form->curcol = iVar4;
  }
  else {
LAB_0037e7b2:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int IFN_Next_Character(FORM * form)
{
  FIELD *field = form->current;
  
  if ((++(form->curcol))==field->dcols)
    {
      if ((++(form->currow))==field->drows)
        {
#if GROW_IF_NAVIGATE
          if (!Single_Line_Field(field) && Field_Grown(field,1)) {
            form->curcol = 0;
            return(E_OK);
          }
#endif
          form->currow--;
#if GROW_IF_NAVIGATE
          if (Single_Line_Field(field) && Field_Grown(field,1))
            return(E_OK);
#endif
          form->curcol--;
          return(E_REQUEST_DENIED);
        }
      form->curcol = 0;
    }
  return(E_OK);
}